

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

bool __thiscall
ON_OffsetSurfaceFunction::SetOffsetPoint
          (ON_OffsetSurfaceFunction *this,double s,double t,double distance,double radius)

{
  undefined1 *puVar1;
  uint uVar2;
  bool bVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  ON_OffsetSurfaceValue offset_value;
  double local_70;
  ON_OffsetSurfaceValue local_50;
  double local_28;
  undefined8 uStack_20;
  
  bVar3 = ON_IsValid(s);
  if ((((bVar3) && (bVar3 = ON_IsValid(t), bVar3)) && (bVar3 = ON_IsValid(distance), bVar3)) &&
     (bVar3 = ON_IsValid(radius), bVar3)) {
    puVar1 = &this->field_0x8;
    local_28 = ON_Interval::NormalizedParameterAt((ON_Interval *)puVar1,s);
    uStack_20 = extraout_XMM0_Qb;
    local_70 = s;
    if (local_28 < 1.490116119385e-08) {
      pdVar4 = ON_Interval::operator[]((ON_Interval *)puVar1,0);
      local_70 = *pdVar4;
      local_28 = 0.0;
      uStack_20 = 0;
    }
    if (0.9999999850988388 < local_28) {
      pdVar4 = ON_Interval::operator[]((ON_Interval *)puVar1,1);
      local_70 = *pdVar4;
      local_28 = 1.0;
      uStack_20 = 0;
    }
    puVar1 = &this->field_0x18;
    dVar8 = ON_Interval::NormalizedParameterAt((ON_Interval *)puVar1,t);
    if (dVar8 < 1.490116119385e-08) {
      pdVar4 = ON_Interval::operator[]((ON_Interval *)puVar1,0);
      t = *pdVar4;
      dVar8 = 0.0;
    }
    if (0.9999999850988388 < dVar8) {
      pdVar4 = ON_Interval::operator[]((ON_Interval *)puVar1,1);
      t = *pdVar4;
      dVar8 = 1.0;
    }
    bVar3 = dVar8 <= 1.0 && ((0.0 <= local_28 && 0.0 <= dVar8) && local_28 <= 1.0);
    if (dVar8 <= 1.0 && ((0.0 <= local_28 && 0.0 <= dVar8) && local_28 <= 1.0)) {
      local_50.m_s = local_70;
      if (radius <= 0.0) {
        radius = 0.0;
      }
      local_50.m_index = (int)((dVar8 * 4096.0 + local_28) * 4096.0);
      uVar2 = (this->m_offset_value).m_count;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = 0;
      }
      else {
        piVar7 = &((this->m_offset_value).m_a)->m_index;
        uVar5 = 0;
        do {
          if (*piVar7 == local_50.m_index) {
            *piVar7 = local_50.m_index;
            *(double *)(piVar7 + -4) = distance;
            *(double *)(piVar7 + -2) = radius;
            ((ON_OffsetSurfaceValue *)(piVar7 + -8))->m_s = local_70;
            *(double *)(piVar7 + -6) = t;
            uVar6 = uVar5;
            break;
          }
          uVar5 = uVar5 + 1;
          piVar7 = piVar7 + 10;
        } while (uVar6 != uVar5);
      }
      if ((int)uVar6 == (this->m_offset_value).m_count) {
        local_50.m_t = t;
        local_50.m_distance = distance;
        local_50.m_radius = radius;
        ON_SimpleArray<ON_OffsetSurfaceValue>::Append(&this->m_offset_value,&local_50);
        if (-1 < (this->m_bumps).m_capacity) {
          (this->m_bumps).m_count = 0;
        }
        this->m_bValid = false;
      }
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_OffsetSurfaceFunction::SetOffsetPoint(
  double s,
  double t,
  double distance,
  double radius
  )
{
  bool rc = false;
  if ( ON_IsValid(s) && ON_IsValid(t) && ON_IsValid(distance) && ON_IsValid(radius) )
  {
    double u = m_domain[0].NormalizedParameterAt(s);

    // 14 Jan 2008, Mikko, TRR 29861:
    // Changing the clamping to happen when the 
    // point is outside or nearly outside the domain.
    const double dTol = ON_SQRT_EPSILON; // tiny border around untrimmed edges

    if ( u < dTol)
    {
      s = m_domain[0][0];
      u = 0.0;
    }
    if ( u > 1.0-dTol)
    {
      s = m_domain[0][1];
      u = 1.0;
    }

    double v = m_domain[1].NormalizedParameterAt(t);
    if ( v < dTol)
    {
      t = m_domain[1][0];
      v = 0.0;
    }
    if ( v > 1.0-dTol)
    {
      t = m_domain[1][1];
      v = 1.0;
    }

    if ( u >= 0.0 && u <= 1.0 && v >= 0.0 && v <= 1.0 )
    {
      ON_OffsetSurfaceValue offset_value;
      offset_value.m_s = s;
      offset_value.m_t = t;
      offset_value.m_distance = distance;
      offset_value.m_radius = (radius > 0.0) ? radius : 0.0;
      offset_value.m_index = (int)((u + v*4096.0)*4096.0);
      int i;
      for ( i = 0; i < m_offset_value.Count(); i++ )
      {
        if ( m_offset_value[i].m_index == offset_value.m_index )
        {
          m_offset_value[i] = offset_value;
          break;
        }
      }
      if (i == m_offset_value.Count())
      {
        m_offset_value.Append(offset_value);
        m_bumps.SetCount(0);
        m_bValid = false;
      }
      rc = true;
    }
  }
  return rc;
}